

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

bool dxil_spv::emit_saturate_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  TypeID TVar3;
  Id IVar4;
  Builder *this;
  Type *pTVar5;
  Operation *this_00;
  Value *value;
  Id local_44;
  Id local_40;
  Id local_3c;
  initializer_list<unsigned_int> local_38;
  
  this = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar2 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar2;
  }
  pTVar5 = LLVMBC::Value::getType((Value *)instruction);
  TVar3 = LLVMBC::Type::getTypeID(pTVar5);
  if (TVar3 == DoubleTyID) {
    IVar2 = spv::Builder::makeDoubleConstant(this,0.0,false);
    IVar4 = spv::Builder::makeDoubleConstant(this,1.0,false);
  }
  else {
    if (TVar3 != FloatTyID) {
      if (TVar3 != HalfTyID) {
        return false;
      }
      bVar1 = Converter::Impl::support_native_fp16_operations(impl);
      if (bVar1) {
        IVar2 = spv::Builder::makeFloat16Constant(this,0,false);
        IVar4 = spv::Builder::makeFloat16Constant(this,0x3c00,false);
        goto LAB_001652e4;
      }
    }
    IVar2 = spv::Builder::makeFloatConstant(this,0.0,false);
    IVar4 = spv::Builder::makeFloatConstant(this,1.0,false);
  }
LAB_001652e4:
  this_00 = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction);
  Operation::add_id(this_00,impl->glsl_std450_ext);
  Operation::add_literal(this_00,0x51);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_44 = Converter::Impl::get_id_for_value(impl,value,0);
  local_38._M_array = &local_44;
  local_38._M_len = 3;
  local_40 = IVar2;
  local_3c = IVar4;
  Operation::add_ids(this_00,&local_38);
  Converter::Impl::add(impl,this_00,false);
  pTVar5 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar5,this_00->id,false);
  return true;
}

Assistant:

bool emit_saturate_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id constant_0, constant_1;

	switch (instruction->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		if (impl.support_native_fp16_operations())
		{
			constant_0 = builder.makeFloat16Constant(0);
			constant_1 = builder.makeFloat16Constant(0x3c00);
		}
		else
		{
			constant_0 = builder.makeFloatConstant(0.0f);
			constant_1 = builder.makeFloatConstant(1.0f);
		}
		break;

	case llvm::Type::TypeID::FloatTyID:
		constant_0 = builder.makeFloatConstant(0.0f);
		constant_1 = builder.makeFloatConstant(1.0f);
		break;

	case llvm::Type::TypeID::DoubleTyID:
		constant_0 = builder.makeDoubleConstant(0.0);
		constant_1 = builder.makeDoubleConstant(1.0);
		break;

	default:
		return false;
	}

	Operation *op = impl.allocate(spv::OpExtInst, instruction);
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(GLSLstd450NClamp);
	op->add_ids({ impl.get_id_for_value(instruction->getOperand(1)),
	              constant_0, constant_1 });

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}